

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IO.h
# Opt level: O2

ostream * Eigen::operator<<(ostream *s,
                           DenseBase<Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_> *m)

{
  ostream *poVar1;
  allocator<char> local_1e6;
  allocator<char> local_1e5;
  allocator<char> local_1e4;
  allocator<char> local_1e3;
  allocator<char> local_1e2;
  allocator<char> local_1e1;
  Matrix<double,_1,__1,_1,_1,__1> local_1e0;
  string local_1d0;
  string local_1b0;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  IOFormat local_110;
  
  Matrix<double,1,-1,1,1,-1>::Matrix<Eigen::Transpose<Eigen::Matrix<double,_1,1,0,_1,1>>>
            ((Matrix<double,1,_1,1,1,_1> *)&local_1e0,
             (Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)m);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_190," ",&local_1e1);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1b0,"\n",&local_1e2);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1d0,"",&local_1e3);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_130,"",&local_1e4);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_150,"",&local_1e5);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_170,"",&local_1e6);
  IOFormat::IOFormat(&local_110,-1,0,&local_190,&local_1b0,&local_1d0,&local_130,&local_150,
                     &local_170,' ');
  poVar1 = internal::print_matrix<Eigen::Matrix<double,1,_1,1,1,_1>>(s,&local_1e0,&local_110);
  IOFormat::~IOFormat(&local_110);
  std::__cxx11::string::~string((string *)&local_170);
  std::__cxx11::string::~string((string *)&local_150);
  std::__cxx11::string::~string((string *)&local_130);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::string::~string((string *)&local_1b0);
  std::__cxx11::string::~string((string *)&local_190);
  free(local_1e0.super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.m_storage.m_data);
  return poVar1;
}

Assistant:

std::ostream & operator <<
(std::ostream & s,
 const DenseBase<Derived> & m)
{
  return internal::print_matrix(s, m.eval(), EIGEN_DEFAULT_IO_FORMAT);
}